

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O1

void __thiscall
so_5::disp::prio_one_thread::reuse::
work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>
::body(work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>
       *this)

{
  demand_queue_t *in_RAX;
  pthread_t pVar1;
  pointer *__ptr;
  demand_unique_ptr_t d;
  demand_queue_t *local_18;
  
  local_18 = in_RAX;
  pVar1 = pthread_self();
  (this->
  super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
  ).super_common_data_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>.
  m_thread_id._M_thread = pVar1;
  do {
    do {
      pop_demand((work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>
                  *)&stack0xffffffffffffffe8);
      call_handler(this,(execution_demand_t *)local_18);
    } while (local_18 == (demand_queue_t *)0x0);
    std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>::operator()
              ((default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t> *)
               &stack0xffffffffffffffe8,(demand_t *)local_18);
  } while( true );
}

Assistant:

void
		body()
			{
				this->m_thread_id = so_5::query_current_thread_id();

				try
					{
						for(;;)
							{
								auto d = this->pop_demand();
								this->call_handler( *d );
							}
					}
				catch( const typename DEMAND_QUEUE::shutdown_ex_t & )
					{}
			}